

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageinput.cc
# Opt level: O3

void __thiscall ImageInput::fwarning(ImageInput *this,string *wmsg)

{
  pointer pcVar1;
  string fwmsg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar1 = (this->_filename)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->_filename)._M_string_length);
  std::__cxx11::string::append((char *)&local_40);
  std::__cxx11::string::_M_append((char *)&local_40,(ulong)(wmsg->_M_dataplus)._M_p);
  if ((this->sendWarning).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->sendWarning)._M_invoker)((_Any_data *)&this->sendWarning,&local_40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ImageInput::fwarning(const std::string& wmsg)
{
    std::string fwmsg = _filename + ": ";
    fwmsg += wmsg;
    warning(fwmsg);
}